

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall Gecko::Graph::reweight(Graph *this,uint k)

{
  Functional *pFVar1;
  ulong uVar2;
  size_type sVar3;
  reference pfVar4;
  value_type_conflict1 in_ESI;
  Graph *in_RDI;
  Float FVar5;
  float fVar6;
  vector<float,_std::allocator<float>_> *unaff_retaddr;
  Index a;
  uint local_10;
  Graph *__new_size;
  
  __new_size = in_RDI;
  std::vector<float,_std::allocator<float>_>::size(&in_RDI->weight);
  std::vector<float,_std::allocator<float>_>::resize(unaff_retaddr,(size_type)__new_size,in_ESI);
  local_10 = 1;
  while( true ) {
    uVar2 = (ulong)local_10;
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&in_RDI->adj);
    if (sVar3 <= uVar2) break;
    pFVar1 = in_RDI->functional;
    pfVar4 = std::vector<float,_std::allocator<float>_>::operator[](&in_RDI->weight,(ulong)local_10)
    ;
    fVar6 = *pfVar4;
    FVar5 = length(in_RDI,(Index)(uVar2 >> 0x20));
    fVar6 = (float)(**(code **)(*(long *)pFVar1 + 0x48))(fVar6,FVar5,pFVar1,in_ESI);
    pfVar4 = std::vector<float,_std::allocator<float>_>::operator[](&in_RDI->bond,(ulong)local_10);
    *pfVar4 = fVar6;
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void
Graph::reweight(uint k)
{
  bond.resize(weight.size());
  for (Arc::Index a = 1; a < adj.size(); a++)
    bond[a] = functional->bond(weight[a], length(a), k);
}